

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_rkv.c
# Opt level: O2

RK_U8 fetch_data(RK_U32 fmt,RK_U8 *line,RK_U32 num)

{
  ulong uVar1;
  byte bVar2;
  undefined4 in_register_0000003c;
  
  uVar1 = (ulong)((uint)((int)line * 10) >> 3);
  bVar2 = (char)line * '\x02' & 6;
  return (RK_U8)(((uint)*(byte *)(CONCAT44(in_register_0000003c,fmt) + 1 + uVar1) <<
                  (8 - bVar2 & 0x1f) |
                 (uint)(*(byte *)(CONCAT44(in_register_0000003c,fmt) + uVar1) >> bVar2)) >> 2);
}

Assistant:

static RK_U8 fetch_data(RK_U32 fmt, RK_U8 *line, RK_U32 num)
{
    RK_U32 offset = 0;
    RK_U32 value = 0;

    if (fmt == MPP_FMT_YUV420SP_10BIT) {
        offset = (num * 2) & 7;
        value = (line[num * 10 / 8] >> offset) |
                (line[num * 10 / 8 + 1] << (8 - offset));

        value = (value & 0x3ff) >> 2;
    } else if (fmt == MPP_FMT_YUV420SP) {
        value = line[num];
    }

    return value;
}